

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O1

void do_drag(CHAR_DATA *ch,char *argument)

{
  EXIT_DATA *pEVar1;
  ROOM_INDEX_DATA *pRoomIndex;
  bool bVar2;
  int iVar3;
  int door;
  int iVar4;
  char *pcVar5;
  CHAR_DATA *victim;
  char *format;
  char dir [4608];
  char target [4608];
  char store [4608];
  char local_3638 [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  iVar3 = get_skill(ch,(int)gsn_drag);
  if (iVar3 == 0) {
    pcVar5 = "Huh?\n\r";
  }
  else {
    if (*argument != '\0') {
      pcVar5 = one_argument(argument,local_2438);
      one_argument(pcVar5,local_3638);
      if (local_2438[0] == '\0') {
        pcVar5 = "Who are you trying to drag?\n\r";
      }
      else if (local_3638[0] == '\0') {
        pcVar5 = "Where are you trying to drag them?\n\r";
      }
      else {
        victim = get_char_room(ch,local_2438);
        if (victim == (CHAR_DATA *)0x0) {
          pcVar5 = "They aren\'t here.\n\r";
        }
        else {
          bVar2 = is_safe_new(ch,victim,true);
          if (bVar2) {
            return;
          }
          bVar2 = is_awake(victim);
          if (bVar2) {
            pcVar5 = "You can only drag unconscious people around.\n\r";
          }
          else {
            bVar2 = is_npc(victim);
            if ((bVar2) && ((victim->act[0] & 2) != 0)) {
              act("You can\'t seem to move $N from $S position!",ch,(void *)0x0,victim,3);
              return;
            }
            if ((victim == ch) && (ch->size + 1 < (int)victim->size)) {
              pcVar5 = "You can\'t drag yourself.\n\r";
            }
            else if (ch->fighting == (CHAR_DATA *)0x0) {
              door = direction_lookup(local_3638);
              if (door == -1) {
                pcVar5 = "That is not a direction!\n\r";
              }
              else {
                pcVar5 = flag_name_lookup((long)door,direction_table);
                strcpy(local_3638,pcVar5);
                pEVar1 = ch->in_room->exit[door];
                if (pEVar1 == (EXIT_DATA *)0x0) {
                  pcVar5 = "You cannot drag anyone that direction.\n\r";
                }
                else {
                  bVar2 = is_npc(victim);
                  if ((bVar2) && (victim->pIndexData->barred_entry != (BARRED_DATA *)0x0)) {
                    pcVar5 = "They are too firmly in place to drag around.\n\r";
                  }
                  else {
                    bVar2 = check_barred(ch,(pEVar1->u1).to_room);
                    if (bVar2) {
                      return;
                    }
                    bVar2 = check_barred(ch,(pEVar1->u1).to_room);
                    if (!bVar2) {
                      bVar2 = is_npc(ch);
                      if (((!bVar2) && (bVar2 = is_npc(victim), !bVar2)) &&
                         ((ch->fighting == (CHAR_DATA *)0x0 ||
                          (victim->fighting == (CHAR_DATA *)0x0)))) {
                        pcVar5 = pers(ch,victim);
                        sprintf(local_1238,"Help! %s is dragging me around!",pcVar5);
                        do_myell(victim,local_1238,ch);
                      }
                      iVar3 = ((int)victim->size - (int)ch->size) * -0xf + iVar3;
                      iVar4 = number_percent();
                      if (iVar4 < iVar3) {
                        act("You grapple $N, and try to drag $M to the $t!",ch,local_3638,victim,3);
                        act("$n grapples $N, and tries to drag $M to the $t!",ch,local_3638,victim,1
                           );
                        pRoomIndex = (pEVar1->u1).to_room;
                        move_char(ch,door,true,false);
                        char_from_room(victim);
                        char_to_room(victim,pRoomIndex);
                        do_look(victim,"auto");
                        if (victim->in_room != ch->in_room) {
                          return;
                        }
                        format = "$n drags $N in from the $t!";
                        pcVar5 = local_3638;
                      }
                      else {
                        act("You grapple $N, and try to drag $M but $E doesn\'t budge!",ch,
                            (void *)0x0,victim,3);
                        format = "$n grapples $N, and tries to drag $M away but $N doesn\'t budge!";
                        pcVar5 = (char *)0x0;
                      }
                      act(format,ch,pcVar5,victim,1);
                      check_improve(ch,(int)gsn_drag,iVar4 < iVar3,1);
                      WAIT_STATE(ch,0x18);
                      return;
                    }
                    pcVar5 = "You were unable to drag them away.\n\r";
                  }
                }
              }
            }
            else {
              pcVar5 = "You can\'t drag anyone while you are fighting!\n\r";
            }
          }
        }
      }
      send_to_char(pcVar5,ch);
      return;
    }
    pcVar5 = "Who are you trying to drag where?\n\r";
  }
  send_to_char(pcVar5,ch);
  return;
}

Assistant:

void do_drag(CHAR_DATA *ch, char *argument)
{
	int where, skill;
	ROOM_INDEX_DATA *to_room;
	EXIT_DATA *pexit;
	CHAR_DATA *victim = nullptr;
	char *direction;
	char store[MSL], target[MSL], dir[MSL];

	/* Must have the skill to use it */
	skill = get_skill(ch, gsn_drag);

	if (skill == 0)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	/* break up the argument into two variables */
	if (!*argument)
	{
		send_to_char("Who are you trying to drag where?\n\r", ch);
		return;
	}

	argument = one_argument(argument, target);
	argument = one_argument(argument, dir);

	if (!*target)
	{
		send_to_char("Who are you trying to drag?\n\r", ch);
		return;
	}

	if (!*dir)
	{
		send_to_char("Where are you trying to drag them?\n\r", ch);
		return;
	}

	/* Set victim */
	victim = get_char_room(ch, target);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	/* Check for pk range */
	if (is_safe_new(ch, victim, true))
		return;

	if (is_awake(victim))
	{
		send_to_char("You can only drag unconscious people around.\n\r", ch);
		return;
	}

	if (is_npc(victim) && IS_SET(victim->act, ACT_SENTINEL))
	{
		act("You can't seem to move $N from $S position!", ch, 0, victim, TO_CHAR);
		return;
	}

	if (victim->size > (ch->size + 1))
	{
		/* Can't push yourself */
		if (victim == ch)
		{
			send_to_char("You can't drag yourself.\n\r", ch);
			return;
		}
	}

	if (ch->fighting)
	{
		send_to_char("You can't drag anyone while you are fighting!\n\r", ch);
		return;
	}

	/* Check to see if the direction verb is valid */
	where = direction_lookup(dir);

	if (where == -1)
	{
		send_to_char("That is not a direction!\n\r", ch);
		return;
	}

	/* Get the default word for the direction */
	direction = flag_name_lookup(where, direction_table);
	sprintf(dir, "%s", direction);

	/* Make sure the exit is valid */
	pexit = ch->in_room->exit[where];

	if (pexit == nullptr)
	{
		send_to_char("You cannot drag anyone that direction.\n\r", ch);
		return;
	}

	if (is_npc(victim) && victim->pIndexData->barred_entry)
	{
		send_to_char("They are too firmly in place to drag around.\n\r", ch);
		return;
	}

	if (check_barred(ch, pexit->u1.to_room))
		return;

	if (check_barred(ch, pexit->u1.to_room))
	{
		send_to_char("You were unable to drag them away.\n\r", ch);
		return;
	}

	if (!is_npc(ch) && !is_npc(victim) && (ch->fighting == nullptr || victim->fighting == nullptr))
	{
		sprintf(store, "Help! %s is dragging me around!", pers(ch, victim));
		do_myell(victim, store, ch);
	}

	skill -= (victim->size - ch->size) * 15;

	if (number_percent() < skill)
	{
		act("You grapple $N, and try to drag $M to the $t!", ch, dir, victim, TO_CHAR);
		act("$n grapples $N, and tries to drag $M to the $t!", ch, dir, victim, TO_NOTVICT);

		to_room = pexit->u1.to_room;

		move_char(ch, where, true, false);

		char_from_room(victim);
		char_to_room(victim, to_room);

		do_look(victim, "auto");

		if (victim->in_room != ch->in_room)
			return;

		act("$n drags $N in from the $t!", ch, dir, victim, TO_NOTVICT);
		check_improve(ch, gsn_drag, true, 1);
	}
	else
	{
		act("You grapple $N, and try to drag $M but $E doesn't budge!", ch, 0, victim, TO_CHAR);
		act("$n grapples $N, and tries to drag $M away but $N doesn't budge!", ch, 0, victim, TO_NOTVICT);
		check_improve(ch, gsn_drag, false, 1);
	}

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}